

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O3

bool __thiscall gl4cts::DirectStateAccess::Textures::BindUnitTest::Draw(BindUnitTest *this)

{
  ostringstream *this_00;
  code *pcVar1;
  ulong uVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 uVar5;
  undefined4 extraout_var;
  undefined **ppuVar7;
  ulong uVar8;
  bool bVar9;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar6;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  (**(code **)(lVar6 + 0x1680))(this->m_po);
  dVar4 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar4,"glUseProgram call has failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0x1c0f);
  (**(code **)(lVar6 + 0xc0))(0,this->m_to[0]);
  local_1c0.m_value = (**(code **)(lVar6 + 0x800))();
  if (local_1c0.m_value == 0) {
    ppuVar7 = &s_fragment_shader_samplers;
    uVar2 = 0;
    do {
      uVar8 = uVar2;
      pcVar1 = *(code **)(lVar6 + 0x14f0);
      uVar5 = (**(code **)(lVar6 + 0xb48))(this->m_po,*ppuVar7);
      (*pcVar1)(uVar5,uVar8 & 0xffffffff);
      dVar4 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar4,"glGetUniformLocation or glUniform1i call has failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                      ,0x1c26);
      if (uVar8 == 3) {
        (**(code **)(lVar6 + 0x538))(5,0,4);
        dVar4 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar4,"glDrawArrays call has failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                        ,0x1c2b);
        return true;
      }
      (**(code **)(lVar6 + 0xc0))(uVar8 + 1 & 0xffffffff,this->m_to[uVar8 + 1]);
      local_1c0.m_value = (**(code **)(lVar6 + 0x800))();
      ppuVar7 = ppuVar7 + 1;
      uVar2 = uVar8 + 1;
    } while (local_1c0.m_value == 0);
    bVar9 = 2 < uVar8;
  }
  else {
    bVar9 = false;
  }
  local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"BindTextureUnit unexpectedly generated error ",0x2d);
  local_1c0.m_getName = glu::getErrorName;
  tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00," when binding texture ",0x16);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," to texture unit ",0x11);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,". Test fails.",0xd);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_138);
  return bVar9;
}

Assistant:

bool BindUnitTest::Draw()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Setup program. */
	gl.useProgram(m_po);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call has failed.");

	/* Bind textures to proper units and setup program's samplers. */
	for (glw::GLuint i = 0; i < 4; ++i)
	{
		/* Tested binding funcion. */
		gl.bindTextureUnit(i, m_to[i]);

		/* Check for errors. */
		glw::GLenum error = GL_NO_ERROR;

		if (GL_NO_ERROR != (error = gl.getError()))
		{
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message << "BindTextureUnit unexpectedly generated error " << glu::getErrorStr(error)
				<< " when binding texture " << m_to[i] << " to texture unit " << i << ". Test fails."
				<< tcu::TestLog::EndMessage;

			return false;
		}

		/* Sampler setup. */
		gl.uniform1i(gl.getUniformLocation(m_po, s_fragment_shader_samplers[i]), i);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformLocation or glUniform1i call has failed.");
	}

	/* Draw call. */
	gl.drawArrays(GL_TRIANGLE_STRIP, 0, 4);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays call has failed.");

	return true;
}